

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiID IVar5;
  ImGuiSettingsHandler *__dest;
  ImGuiViewportP *pIVar6;
  ImGuiViewportP **__dest_00;
  int iVar7;
  int iVar8;
  
  IVar5 = ImHashStr("Window",0,0);
  iVar8 = (context->SettingsHandlers).Size;
  iVar2 = (context->SettingsHandlers).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((long)iVar8 * 0x48,GImAllocatorUserData);
      pIVar3 = (context->SettingsHandlers).Data;
      if (pIVar3 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar3,(long)(context->SettingsHandlers).Size * 0x48);
        pIVar3 = (context->SettingsHandlers).Data;
        if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (context->SettingsHandlers).Data = __dest;
      (context->SettingsHandlers).Capacity = iVar8;
    }
  }
  pIVar3 = (context->SettingsHandlers).Data;
  iVar8 = (context->SettingsHandlers).Size;
  pIVar3[iVar8].TypeName = "Window";
  pIVar3[iVar8].TypeHash = IVar5;
  *(undefined4 *)&pIVar3[iVar8].field_0xc = 0;
  pIVar3[iVar8].ClearAllFn = WindowSettingsHandler_ClearAll;
  pIVar3[iVar8].ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  pIVar3[iVar8].ReadOpenFn = WindowSettingsHandler_ReadOpen;
  pIVar3[iVar8].ReadLineFn = WindowSettingsHandler_ReadLine;
  pIVar3[iVar8].ApplyAllFn = WindowSettingsHandler_ApplyAll;
  pIVar3[iVar8].WriteAllFn = WindowSettingsHandler_WriteAll;
  pIVar3[iVar8].UserData = (void *)0x0;
  (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
  TableSettingsInstallHandler(context);
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  pIVar6 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0xb0,GImAllocatorUserData);
  (pIVar6->super_ImGuiViewport).Flags = 0;
  (pIVar6->super_ImGuiViewport).Pos.x = 0.0;
  *(undefined8 *)&(pIVar6->super_ImGuiViewport).Pos.y = 0;
  *(undefined8 *)&(pIVar6->super_ImGuiViewport).Size.y = 0;
  *(undefined8 *)&(pIVar6->super_ImGuiViewport).WorkPos.y = 0;
  (pIVar6->super_ImGuiViewport).WorkSize.y = 0.0;
  (pIVar6->DrawDataP).Valid = false;
  *(undefined3 *)&(pIVar6->DrawDataP).field_0x1 = 0;
  (pIVar6->DrawDataP).CmdListsCount = 0;
  (pIVar6->DrawDataP).TotalIdxCount = 0;
  (pIVar6->DrawDataP).TotalVtxCount = 0;
  (pIVar6->DrawDataP).CmdLists = (ImDrawList **)0x0;
  (pIVar6->DrawDataP).DisplayPos.x = 0.0;
  (pIVar6->DrawDataP).DisplayPos.y = 0.0;
  (pIVar6->DrawDataP).DisplaySize.x = 0.0;
  (pIVar6->DrawDataP).DisplaySize.y = 0.0;
  (pIVar6->DrawDataP).FramebufferScale.x = 0.0;
  (pIVar6->DrawDataP).FramebufferScale.y = 0.0;
  (pIVar6->DrawDataBuilder).Layers[0].Size = 0;
  (pIVar6->DrawDataBuilder).Layers[0].Capacity = 0;
  (pIVar6->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
  (pIVar6->DrawDataBuilder).Layers[1].Size = 0;
  (pIVar6->DrawDataBuilder).Layers[1].Capacity = 0;
  (pIVar6->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
  (pIVar6->WorkOffsetMin).x = 0.0;
  (pIVar6->WorkOffsetMin).y = 0.0;
  (pIVar6->WorkOffsetMax).x = 0.0;
  (pIVar6->WorkOffsetMax).y = 0.0;
  (pIVar6->CurrWorkOffsetMin).x = 0.0;
  (pIVar6->CurrWorkOffsetMin).y = 0.0;
  (pIVar6->CurrWorkOffsetMax).x = 0.0;
  (pIVar6->CurrWorkOffsetMax).y = 0.0;
  pIVar6->DrawListsLastFrame[0] = -1;
  pIVar6->DrawListsLastFrame[1] = -1;
  pIVar6->DrawLists[0] = (ImDrawList *)0x0;
  pIVar6->DrawLists[1] = (ImDrawList *)0x0;
  iVar8 = (context->Viewports).Size;
  iVar2 = (context->Viewports).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest_00 = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData)
      ;
      ppIVar4 = (context->Viewports).Data;
      if (ppIVar4 != (ImGuiViewportP **)0x0) {
        memcpy(__dest_00,ppIVar4,(long)(context->Viewports).Size << 3);
        ppIVar4 = (context->Viewports).Data;
        if ((ppIVar4 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (context->Viewports).Data = __dest_00;
      (context->Viewports).Capacity = iVar8;
    }
  }
  (context->Viewports).Data[(context->Viewports).Size] = pIVar6;
  (context->Viewports).Size = (context->Viewports).Size + 1;
  context->Initialized = true;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);
#endif // #ifdef IMGUI_HAS_TABLE

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}